

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_parser<char,_std::allocator<char>_>::begin_member_or_element
          (basic_json_parser<char,_std::allocator<char>_> *this,error_code *ec)

{
  parse_state pVar1;
  bool bVar2;
  json_errc local_14;
  
  pVar1 = parent(this);
  if (pVar1 != root) {
    if (pVar1 == array) {
      this->state_ = expect_value;
    }
    else if (pVar1 == object) {
      this->state_ = expect_member_name;
    }
    else {
      if ((this->err_handler_).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      bVar2 = (*(this->err_handler_)._M_invoker)
                        ((_Any_data *)&this->err_handler_,&local_14,&this->super_ser_context);
      this->more_ = bVar2;
      if (!bVar2) {
        std::error_code::operator=(ec,syntax_error);
      }
    }
  }
  return;
}

Assistant:

void begin_member_or_element(std::error_code& ec) 
    {
        switch (parent())
        {
            case parse_state::object:
                state_ = parse_state::expect_member_name;
                break;
            case parse_state::array:
                state_ = parse_state::expect_value;
                break;
            case parse_state::root:
                break;
            default:
                more_ = err_handler_(json_errc::syntax_error, *this);
                if (!more_)
                {
                    ec = json_errc::syntax_error;
                    return;
                }
                break;
        }
    }